

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.cpp
# Opt level: O0

void __thiscall
TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_>::TPZDohrMatrix
          (TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *this,
          TPZAutoPointer<TPZDohrAssembly<double>_> *assembly)

{
  void **in_RSI;
  TPZAutoPointer<TPZDohrAssembly<double>_> *in_RDI;
  TPZAutoPointer<TPZDohrAssembly<double>_> *copy;
  TPZMatrix<double> *in_stack_ffffffffffffffe0;
  
  *(undefined8 *)((long)&in_RDI[1].fRef + 2) = 0;
  *(undefined8 *)((long)&in_RDI[2].fRef + 2) = 0;
  in_RDI->fRef = (TPZReference *)0x0;
  in_RDI[1].fRef = (TPZReference *)0x0;
  TPZMatrix<double>::TPZMatrix(in_stack_ffffffffffffffe0,in_RSI);
  in_RDI->fRef = (TPZReference *)&PTR__TPZDohrMatrix_025aa598;
  copy = in_RDI + 4;
  std::__cxx11::
  list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
  ::list((list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
          *)0x1fd64c7);
  *(undefined4 *)((long)&in_RDI[7].fRef + 4) = 0;
  TPZAutoPointer<TPZDohrAssembly<double>_>::TPZAutoPointer(in_RDI,copy);
  return;
}

Assistant:

TPZDohrMatrix<TVar,TSubStruct>::TPZDohrMatrix(TPZAutoPointer<TPZDohrAssembly<TVar> > assembly)
: TPZMatrix<TVar>(), fNumThreads(0), fAssembly(assembly)
{
}